

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O2

S2Cap * __thiscall
S2MinDistanceEdgeTarget::GetCapBound(S2Cap *__return_storage_ptr__,S2MinDistanceEdgeTarget *this)

{
  double dVar1;
  S1ChordAngle radius;
  D local_50;
  double local_38;
  double dStack_30;
  double local_28;
  
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_50,&this->a_,&this->b_);
  dVar1 = local_50.c_[0] * -0.25 + 1.0;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  local_28 = (this->a_).c_[2] + (this->b_).c_[2];
  local_38 = (this->b_).c_[0] + (this->a_).c_[0];
  dStack_30 = (this->b_).c_[1] + (this->a_).c_[1];
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (&local_50,(BasicVector<Vector3,_double,_3UL> *)&local_38);
  radius = S1ChordAngle::FromLength2((local_50.c_[0] * 0.5) / (dVar1 + 1.0));
  S2Cap::S2Cap(__return_storage_ptr__,&local_50,radius);
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2MinDistanceEdgeTarget::GetCapBound() {
  // The following computes a radius equal to half the edge length in an
  // efficient and numerically stable way.
  double d2 = S1ChordAngle(a_, b_).length2();
  double r2 = (0.5 * d2) / (1 + sqrt(1 - 0.25 * d2));
  return S2Cap((a_ + b_).Normalize(), S1ChordAngle::FromLength2(r2));
}